

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O2

NodeOutputData *
dxil_spv::Converter::Impl::get_node_output(NodeOutputData *__return_storage_ptr__,MDNode *output)

{
  uint uVar1;
  uint uVar2;
  MDOperand *md;
  MDNode *node;
  uint in_ECX;
  uint index;
  String local_50;
  
  (__return_storage_ptr__->node_id)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->node_id).field_2;
  (__return_storage_ptr__->node_id)._M_string_length = 0;
  (__return_storage_ptr__->node_id).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->node_array_index = 0;
  __return_storage_ptr__->node_array_size = 0;
  __return_storage_ptr__->node_index_spec_constant_id = 0;
  __return_storage_ptr__->max_records = 0;
  __return_storage_ptr__->sparse_array = false;
  uVar1 = LLVMBC::MDNode::getNumOperands(output);
  for (index = 1; index - 1 < uVar1; index = index + 2) {
    uVar2 = get_constant_metadata<unsigned_int>(output,index - 1);
    switch(uVar2) {
    case 0:
      md = LLVMBC::MDNode::getOperand(output,index);
      node = LLVMBC::cast<LLVMBC::MDNode>(md);
      get_string_metadata_abi_cxx11_(&local_50,(dxil_spv *)node,(MDNode *)0x0,in_ECX);
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::operator=
                (&__return_storage_ptr__->node_id,&local_50);
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::_M_dispose
                (&local_50);
      uVar2 = get_constant_metadata<unsigned_int>(node,1);
      __return_storage_ptr__->node_array_index = uVar2;
      break;
    case 3:
      uVar2 = get_constant_metadata<unsigned_int>(output,index);
      __return_storage_ptr__->max_records = uVar2;
      break;
    case 5:
      uVar2 = get_constant_metadata<unsigned_int>(output,index);
      __return_storage_ptr__->node_array_size = uVar2;
      break;
    case 6:
      uVar2 = get_constant_metadata<unsigned_int>(output,index);
      __return_storage_ptr__->sparse_array = uVar2 != 0;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

NodeOutputData Converter::Impl::get_node_output(llvm::MDNode *output)
{
	NodeOutputData data = {};

	uint32_t num_ops = output->getNumOperands();
	for (uint32_t i = 0; i < num_ops; i += 2)
	{
		auto tag = DXIL::NodeMetadataTag(get_constant_metadata(output, i));
		if (tag == DXIL::NodeMetadataTag::NodeOutputID)
		{
			auto *output_node = llvm::cast<llvm::MDNode>(output->getOperand(i + 1));
			data.node_id = get_string_metadata(output_node, 0);
			data.node_array_index = get_constant_metadata(output_node, 1);
		}
		else if (tag == DXIL::NodeMetadataTag::NodeAllowSparseNodes)
			data.sparse_array = get_constant_metadata(output, i + 1) != 0;
		else if (tag == DXIL::NodeMetadataTag::NodeOutputArraySize)
			data.node_array_size = get_constant_metadata(output, i + 1);
		else if (tag == DXIL::NodeMetadataTag::NodeMaxRecords)
			data.max_records = get_constant_metadata(output, i + 1);
	}

	return data;
}